

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontStructMatrix.cpp
# Opt level: O0

void __thiscall
TPZFrontStructMatrix<TPZFrontNonSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
::Assemble(TPZFrontStructMatrix<TPZFrontNonSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
           *this,TPZBaseMatrix *stiff_base,TPZBaseMatrix *rhs_base,
          TPZAutoPointer<TPZGuiInterface> *guiInterface)

{
  TPZCompEl *pTVar1;
  bool bVar2;
  TPZFrontStructMatrix<TPZFrontNonSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
  *this_00;
  TPZCompEl *el_00;
  TPZElementMatrix *ekb;
  TPZElementMatrix *efb;
  void *this_01;
  ostream *poVar3;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int matid;
  TPZMaterial *mat;
  TPZCompEl *el;
  int64_t elindex;
  TPZVec<int> elorder;
  TPZAdmChunkVector<TPZCompEl_*,_10> *elementvec;
  TPZElementMatrixT<std::complex<double>_> ef;
  TPZElementMatrixT<std::complex<double>_> ek;
  int64_t nelem;
  int64_t numel;
  int64_t iel;
  TPZFMatrix<std::complex<double>_> *rhs;
  TPZMatrix<std::complex<double>_> *stiffness;
  TPZElementMatrixT<std::complex<double>_> *in_stack_fffffffffffefb30;
  int64_t in_stack_fffffffffffefb38;
  TPZVec<int> *in_stack_fffffffffffefb40;
  TPZFMatrix<std::complex<double>_> *in_stack_fffffffffffefb48;
  undefined4 in_stack_fffffffffffefb50;
  int in_stack_fffffffffffefb54;
  TPZCompMesh *in_stack_fffffffffffefb60;
  TPZCompMesh *in_stack_fffffffffffefb68;
  TPZElementMatrixT<std::complex<double>_> *in_stack_fffffffffffefb70;
  long lStack_10470;
  long lStack_10460;
  undefined1 auStack_103e8 [664];
  TPZFrontStructMatrix<TPZFrontNonSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
  *in_stack_fffffffffffefeb0;
  size_t in_stack_fffffffffffeff48;
  char *in_stack_fffffffffffeff50;
  undefined1 local_8218 [33232];
  int64_t local_48;
  long local_40;
  int64_t local_38;
  long local_30;
  long local_28;
  long local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (in_RSI == 0) {
    lStack_10460 = 0;
  }
  else {
    lStack_10460 = __dynamic_cast(in_RSI,&TPZBaseMatrix::typeinfo,
                                  &TPZMatrix<std::complex<double>>::typeinfo,0);
  }
  if (lStack_10460 != 0) {
    if (local_18 == 0) {
      lStack_10470 = 0;
    }
    else {
      lStack_10470 = __dynamic_cast(local_18,&TPZBaseMatrix::typeinfo,
                                    &TPZFMatrix<std::complex<double>>::typeinfo,0);
    }
    if (lStack_10470 == 0) goto LAB_01dcde98;
  }
  std::operator<<((ostream *)&std::cerr,
                  "virtual void TPZFrontStructMatrix<TPZFrontNonSym<std::complex<double>>, std::complex<double>, TPZStructMatrixOT<CSTATE>>::Assemble(TPZBaseMatrix &, TPZBaseMatrix &, TPZAutoPointer<TPZGuiInterface>) [TFront = TPZFrontNonSym<std::complex<double>>, TVar = std::complex<double>, TPar = TPZStructMatrixOT<CSTATE>]"
                 );
  std::operator<<((ostream *)&std::cerr," incompatible types. Aborting...\n");
  pzinternal::DebugStopImpl(in_stack_fffffffffffeff50,in_stack_fffffffffffeff48);
LAB_01dcde98:
  local_28 = __dynamic_cast(local_10,&TPZBaseMatrix::typeinfo,
                            &TPZMatrix<std::complex<double>>::typeinfo,0);
  if (local_28 == 0) {
    __cxa_bad_cast();
  }
  local_30 = __dynamic_cast(local_18,&TPZBaseMatrix::typeinfo,
                            &TPZFMatrix<std::complex<double>>::typeinfo,0);
  if (local_30 == 0) {
    __cxa_bad_cast();
  }
  local_40 = 0;
  local_48 = TPZCompMesh::NElements((TPZCompMesh *)0x1dcdf2d);
  TPZElementMatrixT<std::complex<double>_>::TPZElementMatrixT
            (in_stack_fffffffffffefb70,in_stack_fffffffffffefb68,
             (MType)((ulong)in_stack_fffffffffffefb60 >> 0x20));
  TPZElementMatrixT<std::complex<double>_>::TPZElementMatrixT
            (in_stack_fffffffffffefb70,in_stack_fffffffffffefb68,
             (MType)((ulong)in_stack_fffffffffffefb60 >> 0x20));
  TPZCompMesh::ElementVec(*(TPZCompMesh **)(in_RDI + 8));
  this_00 = (TPZFrontStructMatrix<TPZFrontNonSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
             *)TPZCompMesh::NEquations(in_stack_fffffffffffefb60);
  TPZVec<int>::TPZVec(in_stack_fffffffffffefb40,in_stack_fffffffffffefb38,
                      (int *)in_stack_fffffffffffefb30);
  OrderElement(in_stack_fffffffffffefeb0);
  local_38 = 0;
  do {
    if (local_48 <= local_38) {
      TPZVec<int>::~TPZVec((TPZVec<int> *)in_stack_fffffffffffefb30);
      TPZElementMatrixT<std::complex<double>_>::~TPZElementMatrixT(in_stack_fffffffffffefb30);
      TPZElementMatrixT<std::complex<double>_>::~TPZElementMatrixT(in_stack_fffffffffffefb30);
      return;
    }
    el_00 = (TPZCompEl *)TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x120),local_38);
    if (-1 < *(int *)el_00) {
      ekb = (TPZElementMatrix *)
            TPZChunkVector<TPZCompEl_*,_10>::operator[]
                      ((TPZChunkVector<TPZCompEl_*,_10> *)
                       CONCAT44(in_stack_fffffffffffefb54,in_stack_fffffffffffefb50),
                       (int64_t)in_stack_fffffffffffefb48);
      pTVar1 = (TPZCompEl *)ekb->_vptr_TPZElementMatrix;
      if (pTVar1 != (TPZCompEl *)0x0) {
        efb = (TPZElementMatrix *)(**(code **)(*(long *)pTVar1 + 0xb8))();
        if (efb != (TPZElementMatrix *)0x0) {
          in_stack_fffffffffffefb54 = (*efb->_vptr_TPZElementMatrix[0xb])();
          bVar2 = ::TPZStructMatrix::ShouldCompute
                            ((TPZStructMatrix *)
                             CONCAT44(in_stack_fffffffffffefb54,in_stack_fffffffffffefb50),
                             (int)((ulong)in_stack_fffffffffffefb48 >> 0x20));
          in_stack_fffffffffffefb50 = CONCAT13(bVar2,(int3)in_stack_fffffffffffefb50);
          if (!bVar2) goto LAB_01dce2e5;
        }
        (**(code **)(*(long *)pTVar1 + 0x110))(pTVar1,local_8218,auStack_103e8);
        in_stack_fffffffffffefb48 =
             (TPZFMatrix<std::complex<double>_> *)
             std::operator<<((ostream *)&std::cout," assemblando elemento frontal ");
        this_01 = (void *)std::ostream::operator<<(in_stack_fffffffffffefb48,local_38);
        std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
        AssembleElement(this_00,el_00,ekb,efb,
                        (TPZMatrix<std::complex<double>_> *)
                        CONCAT44(in_stack_fffffffffffefb54,in_stack_fffffffffffefb50),
                        in_stack_fffffffffffefb48);
        if ((*(int *)(in_RDI + 0x140) == 0) &&
           (std::operator<<((ostream *)&std::cout,'*'), local_40 % 0x14 == 0)) {
          poVar3 = std::operator<<((ostream *)&std::cout," ");
          in_stack_fffffffffffefb30 =
               (TPZElementMatrixT<std::complex<double>_> *)
               std::ostream::operator<<(poVar3,(local_38 * 100) / local_48);
          poVar3 = std::operator<<((ostream *)in_stack_fffffffffffefb30,"% Elements assembled ");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          std::ostream::flush();
        }
        local_40 = local_40 + 1;
      }
    }
LAB_01dce2e5:
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

void TPZFrontStructMatrix<TFront,TVar,TPar>::Assemble(TPZBaseMatrix & stiff_base, TPZBaseMatrix & rhs_base, TPZAutoPointer<TPZGuiInterface> guiInterface){
    if(!dynamic_cast<TPZMatrix<TVar>*>(&stiff_base) ||
       dynamic_cast<TPZFMatrix<TVar>*>(&rhs_base)){
        PZError<<__PRETTY_FUNCTION__;
        PZError<<" incompatible types. Aborting...\n";
        DebugStop();
    }
	auto& stiffness = dynamic_cast<TPZMatrix<TVar>&>(stiff_base);
    auto& rhs = dynamic_cast<TPZFMatrix<TVar>&>(rhs_base);
	int64_t iel;
	int64_t numel = 0, nelem = this->fMesh->NElements();
	TPZElementMatrixT<TVar> ek(this->fMesh,TPZElementMatrix::EK),ef(this->fMesh,TPZElementMatrix::EF);
	
	TPZAdmChunkVector<TPZCompEl *> &elementvec = this->fMesh->ElementVec();
	
	
	/**Rearange elements order*/
	TPZVec<int> elorder(this->fMesh->NEquations(),0);
	
	OrderElement();
	
	for(iel=0; iel < nelem; iel++) {
		
        int64_t elindex = fElementOrder[iel];
		if(elindex < 0) continue;
		TPZCompEl *el = elementvec[elindex];
		if(!el) continue;
		TPZMaterial * mat = el->Material();
		if(mat)
		{
			int matid = mat->Id();
			if(this->ShouldCompute(matid) == false)
			{
				continue;
			}
		}
		else
		{
		}
		
		//		int dim = el->NumNodes();
		
		//Builds elements stiffness matrix
		el->CalcStiff(ek,ef);
		
		
		std::cout<< " assemblando elemento frontal " << iel <<std::endl;
		
#ifdef PZ_LOG
        if (logger.isDebugEnabled())
		{
			std::stringstream sout;
			ek.fMat.Print("Element stiffness Frontal",sout);
			LOGPZ_DEBUG(logger,sout.str())
		}
#endif
		
		AssembleElement(el, ek, ef, stiffness, rhs);
#ifdef PZ_LOG
		if(loggerel.isDebugEnabled())
		{
			std::stringstream sout;
			ek.fMat.Print("Element stiffness depois de assemblada ",sout);
			LOGPZ_DEBUG(loggerel,sout.str())
		}
#endif
		
		if(!f_quiet)
		{
			cout << '*';
			if(!(numel%20)) {
				cout << " " << (100*iel/nelem) << "% Elements assembled " << endl;
				cout.flush();
			}
		}
		numel++;
		
	}//fim for iel
	
}